

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

bool common::WriteSettings
               (path *path,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *values,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *errors)

{
  bool bVar1;
  byte bVar2;
  ostream *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  ofstream file;
  SettingsValue out;
  undefined4 in_stack_fffffffffffffb88;
  openmode in_stack_fffffffffffffb8c;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  string *in_stack_fffffffffffffb98;
  UniValue *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  UniValue *this_00;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  UniValue *in_stack_fffffffffffffbc0;
  UniValue *in_stack_fffffffffffffbc8;
  UniValue *in_stack_fffffffffffffbd0;
  bool local_401;
  UniValue local_3f0;
  ostream local_390 [784];
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_80;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  UniValue::UniValue((UniValue *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                     (VType)((ulong)in_stack_fffffffffffffba0 >> 0x20),in_stack_fffffffffffffb98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbd0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc8);
  tinyformat::format<char[13]>
            ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (char (*) [13])this_00);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffbc8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffbc0);
  UniValue::pushKV(in_stack_fffffffffffffbd0,(string *)in_stack_fffffffffffffbc8,
                   in_stack_fffffffffffffbc0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
         *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  while( true ) {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb98,
                            (_Self *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                 *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbd0,in_RSI);
    UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       this_00);
    UniValue::pushKVEnd(this_00,(string *)
                                CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                        in_stack_fffffffffffffba0);
    UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                  *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  }
  std::ofstream::ofstream(local_390);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<fs::path>
            ((basic_ofstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffb98,
             (path *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90),
             in_stack_fffffffffffffb8c);
  bVar2 = std::ios::fail();
  local_401 = (bVar2 & 1) != 0;
  if (local_401) {
    fs::PathToString_abi_cxx11_
              ((path *)CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
    tinyformat::format<std::__cxx11::string>
              ((char *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(bVar2,in_stack_fffffffffffffba8),in_RDX);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  }
  else {
    UniValue::write_abi_cxx11_(&local_3f0,(int)&local_80 + 0x20,(void *)0x4,1);
    this = std::operator<<(local_390,(string *)&local_3f0);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    std::ofstream::close();
  }
  local_401 = !local_401;
  std::ofstream::~ofstream(local_390);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_401;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteSettings(const fs::path& path,
    const std::map<std::string, SettingsValue>& values,
    std::vector<std::string>& errors)
{
    SettingsValue out(SettingsValue::VOBJ);
    // Add auto-generated warning comment
    out.pushKV(SETTINGS_WARN_MSG_KEY, strprintf("This file is automatically generated and updated by %s. Please do not edit this file while the node "
                                                "is running, as any changes might be ignored or overwritten.", PACKAGE_NAME));
    // Push settings values
    for (const auto& value : values) {
        out.pushKVEnd(value.first, value.second);
    }
    std::ofstream file;
    file.open(path);
    if (file.fail()) {
        errors.emplace_back(strprintf("Error: Unable to open settings file %s for writing", fs::PathToString(path)));
        return false;
    }
    file << out.write(/* prettyIndent= */ 4, /* indentLevel= */ 1) << std::endl;
    file.close();
    return true;
}